

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O0

ctmbstr tidyErrorCodeAsString(uint code)

{
  uint local_18;
  uint i;
  uint code_local;
  
  local_18 = 0;
  while( true ) {
    if (tidyErrorFilterKeysStruct[local_18].key == (ctmbstr)0x0) {
      return "UNDEFINED";
    }
    if (tidyErrorFilterKeysStruct[local_18].value == code) break;
    local_18 = local_18 + 1;
  }
  return tidyErrorFilterKeysStruct[local_18].key;
}

Assistant:

ctmbstr tidyErrorCodeAsString(uint code)
{
    uint i = 0;
    while (tidyErrorFilterKeysStruct[i].key) {
        if ( tidyErrorFilterKeysStruct[i].value == code )
            return tidyErrorFilterKeysStruct[i].key;
        i++;
    }
    return "UNDEFINED";
}